

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O2

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar uVar3;
  uint starting_bits;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong size;
  long lVar7;
  
  uVar5 = (ulong)((int)end - (int)*p);
  size = (long)(length + 1);
  if (uVar5 < (ulong)(long)(length + 1)) {
    size = uVar5;
  }
  lws_strncpy((char *)*p,(char *)value,size);
  starting_bits = 0;
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,*p,length);
  sVar6 = strlen((char *)name);
  iVar4 = (int)sVar6;
  if (iVar4 != 0) {
    starting_bits = iVar4 - (uint)(name[iVar4 + -1] == ':');
  }
  if (((wsi->field_0x46e & 2) == 0) ||
     (iVar4 = strncmp((char *)name,"transfer-encoding",(ulong)starting_bits), iVar4 != 0)) {
    puVar1 = *p;
    if ((long)end - (long)puVar1 < (long)(int)(length + starting_bits + 8)) {
      return 1;
    }
    *p = puVar1 + 1;
    *puVar1 = '\0';
    uVar3 = '\x7f';
    if (starting_bits < 0x7f) {
      uVar3 = (uchar)starting_bits;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = uVar3;
    iVar4 = lws_h2_num(starting_bits,(unsigned_long)p,(uchar **)end,puVar1);
    if (iVar4 != 0) {
      return 1;
    }
    for (lVar7 = 0; starting_bits != (uint)lVar7; lVar7 = lVar7 + 1) {
      iVar4 = tolower((uint)name[lVar7]);
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = (uchar)iVar4;
    }
    uVar3 = '\x7f';
    if ((ulong)(long)length < 0x7f) {
      uVar3 = (uchar)length;
    }
    puVar2 = *p;
    puVar1 = puVar2 + 1;
    *p = puVar1;
    *puVar2 = uVar3;
    iVar4 = lws_h2_num(length,(unsigned_long)p,(uchar **)end,puVar1);
    if (iVar4 != 0) {
      return 1;
    }
    memcpy(*p,value,(ulong)(uint)length);
    *p = *p + length;
  }
  else {
    _lws_log(0x40,"rejecting %s\n",name);
  }
  return 0;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

#if defined(_DEBUG)
	/* value does not have to be NUL-terminated... %.*s not available on
	 * all platforms */
	lws_strnncpy((char *)*p, (const char *)value, length,
			lws_ptr_diff(end, (*p)));

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name,
			(const char *)*p, length);
#endif

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", (unsigned int)len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)len)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = (uint8_t)tolower((int)*name++);

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)length)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)length, p, end))
		return 1;

	memcpy(*p, value, (unsigned int)length);
	*p += length;

	return 0;
}